

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall aiMetadata::HasKey(aiMetadata *this,char *key)

{
  int iVar1;
  char *__s1;
  uint local_24;
  uint i;
  char *key_local;
  aiMetadata *this_local;
  
  if (key != (char *)0x0) {
    for (local_24 = 0; local_24 < this->mNumProperties; local_24 = local_24 + 1) {
      __s1 = aiString::C_Str(this->mKeys + local_24);
      iVar1 = strncmp(__s1,key,(ulong)this->mKeys[local_24].length);
      if (iVar1 == 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline
    bool HasKey(const char* key) {
        if ( nullptr == key ) {
            return false;
        }
        
        // Search for the given key
        for (unsigned int i = 0; i < mNumProperties; ++i) {
            if ( 0 == strncmp(mKeys[i].C_Str(), key, mKeys[i].length ) ) {
                return true;
            }
        }
        return false;
    }